

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::GenerateCountedDigits
               (int count,int *decimal_point,Bignum *numerator,Bignum *denominator,
               Vector<char> buffer,int *length)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  int *in_RSI;
  int in_EDI;
  Bignum *in_R8;
  int in_R9D;
  int *in_stack_00000008;
  int i_1;
  uint16_t digit;
  uint16_t digit_1;
  int i;
  int local_3c;
  char local_38;
  int local_34;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  
  for (local_34 = 0; local_34 < in_EDI + -1; local_34 = local_34 + 1) {
    uVar1 = Bignum::DivideModuloIntBignum
                      ((Bignum *)CONCAT44(in_stack_fffffffffffffffc,in_R9D),in_R8);
    pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,local_34);
    *pcVar3 = (char)uVar1 + '0';
    Bignum::Times10((Bignum *)0xbf444b);
  }
  uVar1 = Bignum::DivideModuloIntBignum((Bignum *)CONCAT44(in_stack_fffffffffffffffc,in_R9D),in_R8);
  local_38 = (char)uVar1;
  iVar2 = Bignum::PlusCompare((Bignum *)CONCAT44(in_stack_fffffffffffffffc,in_R9D),in_R8,
                              (Bignum *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
  if (-1 < iVar2) {
    local_38 = local_38 + '\x01';
  }
  pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,in_EDI + -1);
  *pcVar3 = local_38 + '0';
  iVar2 = in_EDI;
  while ((local_3c = iVar2 + -1, 0 < local_3c &&
         (pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,local_3c),
         *pcVar3 == ':'))) {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,local_3c);
    *pcVar3 = '0';
    pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,iVar2 + -2);
    *pcVar3 = *pcVar3 + '\x01';
    iVar2 = local_3c;
  }
  pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,0);
  if (*pcVar3 == ':') {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,0);
    *pcVar3 = '1';
    *in_RSI = *in_RSI + 1;
  }
  *in_stack_00000008 = in_EDI;
  return;
}

Assistant:

static void GenerateCountedDigits(int count, int* decimal_point,
                                  Bignum* numerator, Bignum* denominator,
                                  Vector<char> buffer, int* length) {
  DOUBLE_CONVERSION_ASSERT(count >= 0);
  for (int i = 0; i < count - 1; ++i) {
    uint16_t digit;
    digit = numerator->DivideModuloIntBignum(*denominator);
    DOUBLE_CONVERSION_ASSERT(digit <= 9);  // digit is a uint16_t and therefore always positive.
    // digit = numerator / denominator (integer division).
    // numerator = numerator % denominator.
    buffer[i] = static_cast<char>(digit + '0');
    // Prepare for next iteration.
    numerator->Times10();
  }
  // Generate the last digit.
  uint16_t digit;
  digit = numerator->DivideModuloIntBignum(*denominator);
  if (Bignum::PlusCompare(*numerator, *numerator, *denominator) >= 0) {
    digit++;
  }
  DOUBLE_CONVERSION_ASSERT(digit <= 10);
  buffer[count - 1] = static_cast<char>(digit + '0');
  // Correct bad digits (in case we had a sequence of '9's). Propagate the
  // carry until we hat a non-'9' or til we reach the first digit.
  for (int i = count - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) break;
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  if (buffer[0] == '0' + 10) {
    // Propagate a carry past the top place.
    buffer[0] = '1';
    (*decimal_point)++;
  }
  *length = count;
}